

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::Utils::program::compile(program *this,GLuint shader_id,shaderSource *source)

{
  pointer psVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ulong __new_size;
  shaderCompilationException *this_00;
  ulong uVar6;
  pointer piVar7;
  GLint length;
  GLint status;
  vector<int,_std::allocator<int>_> lengths_vector;
  vector<char,_std::allocator<char>_> message;
  vector<const_char_*,_std::allocator<const_char_*>_> parts;
  long lVar5;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  status = 0;
  parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&parts,((long)(source->m_parts).
                           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(source->m_parts).
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  uVar3 = 0;
  while( true ) {
    uVar6 = (ulong)uVar3;
    psVar1 = (source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __new_size = ((long)(source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) / 0x28;
    if (__new_size <= uVar6) break;
    parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = psVar1[uVar6].m_code._M_dataplus._M_p;
    uVar3 = uVar3 + 1;
  }
  if (source->m_use_lengths == false) {
    piVar7 = (pointer)0x0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize(&lengths_vector,__new_size);
    psVar1 = (source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __new_size = ((long)(source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) / 0x28;
    for (uVar3 = 0; uVar6 = (ulong)uVar3,
        piVar7 = lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar6 < __new_size; uVar3 = uVar3 + 1) {
      lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = psVar1[uVar6].m_length;
    }
  }
  (**(code **)(lVar5 + 0x12b8))
            (shader_id,__new_size & 0xffffffff,
             parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start,piVar7);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"ShaderSource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x465a);
  (**(code **)(lVar5 + 0x248))(shader_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x465e);
  (**(code **)(lVar5 + 0xa70))(shader_id,0x8b81,&status);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4662);
  if (status != 1) {
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (**(code **)(lVar5 + 0xa70))(shader_id,0x8b84);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"GetShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x466c);
    std::vector<char,_std::allocator<char>_>::resize(&message,0);
    (**(code **)(lVar5 + 0xa58))
              (shader_id,0,0,
               message.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"GetShaderInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x4673);
    this_00 = (shaderCompilationException *)__cxa_allocate_exception(0x48);
    shaderCompilationException::shaderCompilationException
              (this_00,source,
               message.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    __cxa_throw(this_00,&shaderCompilationException::typeinfo,
                shaderCompilationException::~shaderCompilationException);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&lengths_vector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return;
}

Assistant:

void Utils::program::compile(glw::GLuint shader_id, const Utils::shaderSource& source) const
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Compilation status */
	glw::GLint status = GL_FALSE;

	/* Source parts and lengths vectors */
	std::vector<const GLchar*> parts;
	std::vector<GLint>		   lengths_vector;
	GLint*					   lengths = 0;

	/* Prepare storage */
	parts.resize(source.m_parts.size());

	/* Prepare arrays */
	for (GLuint i = 0; i < source.m_parts.size(); ++i)
	{
		parts[i] = source.m_parts[i].m_code.c_str();
	}

	if (true == source.m_use_lengths)
	{
		lengths_vector.resize(source.m_parts.size());

		for (GLuint i = 0; i < source.m_parts.size(); ++i)
		{
			lengths_vector[i] = source.m_parts[i].m_length;
		}

		lengths = &lengths_vector[0];
	}

	/* Set source code */
	gl.shaderSource(shader_id, static_cast<GLsizei>(source.m_parts.size()), &parts[0], lengths);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderSource");

	/* Compile */
	gl.compileShader(shader_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

	/* Get compilation status */
	gl.getShaderiv(shader_id, GL_COMPILE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

	/* Log compilation error */
	if (GL_TRUE != status)
	{
		glw::GLint				 length = 0;
		std::vector<glw::GLchar> message;

		/* Error log length */
		gl.getShaderiv(shader_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length);

		/* Get error log */
		gl.getShaderInfoLog(shader_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		throw shaderCompilationException(source, &message[0]);
	}
}